

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_4U>::getSINTPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  uint uVar1;
  Color *pCVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined8 uVar10;
  ulong uVar11;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint32_t x;
  uint uVar12;
  allocator_type local_71;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  undefined8 local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  pointer local_38;
  
  uVar10 = CONCAT44(in_register_00000014,c0);
  local_68 = CONCAT44(in_register_0000000c,c1);
  local_48 = CONCAT44(in_register_0000008c,c3);
  local_50 = CONCAT44(in_register_00000084,c2);
  local_58 = (ulong)(c3 + c2);
  local_70 = __return_storage_ptr__;
  if (c0 + c1 + c3 + c2 != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x431,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  if ((((c0 != 0) && (c1 != 0)) && (c2 != 0)) && (c3 != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((this->super_Image).width * (this->super_Image).height) << 2,&local_71);
    local_60 = (int)local_68 + (int)local_58;
    local_40 = uVar10;
    for (local_5c = 0; local_5c < (this->super_Image).height; local_5c = local_5c + 1) {
      for (uVar12 = 0; uVar1 = (this->super_Image).width, uVar12 < uVar1; uVar12 = uVar12 + 1) {
        pCVar2 = this->pixels;
        uVar11 = (ulong)(uVar1 * local_5c + uVar12);
        local_38 = (local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        uVar3 = imageio::convertSINT((uint)pCVar2[uVar11].field_0.comps[0],0x20,(uint32_t)uVar10);
        bVar7 = (byte)local_60;
        uVar4 = imageio::convertSINT((uint)pCVar2[uVar11].field_0.comps[1],0x20,(uint32_t)local_68);
        bVar8 = (byte)local_58;
        uVar5 = imageio::convertSINT((uint)pCVar2[uVar11].field_0.comps[2],0x20,(uint32_t)local_50);
        bVar9 = (byte)local_48;
        uVar6 = imageio::convertSINT((uint)pCVar2[uVar11].field_0.comps[3],0x20,(uint32_t)local_48);
        *(uint32_t *)(local_38 + uVar11 * 4) =
             uVar6 | uVar5 << (bVar9 & 0x1f) | uVar4 << (bVar8 & 0x1f) | uVar3 << (bVar7 & 0x1f);
        uVar10 = local_40;
      }
    }
    return local_70;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x432,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[0])), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[1])), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[2])), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[3])), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }